

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QRectF * setupTextLayout(QRectF *__return_storage_ptr__,QTextLayout *layout)

{
  int iVar1;
  undefined4 uVar2;
  long extraout_RDX;
  qreal extraout_RDX_00;
  int i;
  int iVar3;
  long in_FS_OFFSET;
  double dVar4;
  double dVar5;
  double local_68;
  double local_60;
  QPointF local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QTextLayout::setCacheEnabled(SUB81(layout,0));
  QTextLayout::beginLayout();
  do {
    QTextLayout::createLine();
  } while (extraout_RDX != 0);
  QTextLayout::endLayout();
  iVar3 = 0;
  local_60 = 0.0;
  local_68 = 0.0;
  while( true ) {
    iVar1 = QTextLayout::lineCount();
    if (iVar1 <= iVar3) break;
    local_48.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    local_48.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    uVar2 = QTextLayout::lineAt((int)layout);
    local_48.xp = (qreal)CONCAT44(local_48.xp._4_4_,uVar2);
    local_48.yp = extraout_RDX_00;
    dVar4 = (double)QTextLine::naturalTextWidth();
    if (dVar4 <= local_60) {
      dVar4 = local_60;
    }
    QTextLine::setPosition(&local_48);
    dVar5 = (double)QTextLine::height();
    local_68 = local_68 + dVar5;
    iVar3 = iVar3 + 1;
    local_60 = dVar4;
  }
  __return_storage_ptr__->xp = 0.0;
  __return_storage_ptr__->yp = 0.0;
  __return_storage_ptr__->w = local_60;
  __return_storage_ptr__->h = local_68;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QRectF setupTextLayout(QTextLayout *layout)
{
    layout->setCacheEnabled(true);
    layout->beginLayout();
    while (layout->createLine().isValid())
        ;
    layout->endLayout();
    qreal maxWidth = 0;
    qreal y = 0;
    for (int i = 0; i < layout->lineCount(); ++i) {
        QTextLine line = layout->lineAt(i);
        maxWidth = qMax(maxWidth, line.naturalTextWidth());
        line.setPosition(QPointF(0, y));
        y += line.height();
    }
    return QRectF(0, 0, maxWidth, y);
}